

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

bool __thiscall cmCTestGIT::LoadModifications(cmCTestGIT *this)

{
  long lVar1;
  pointer pCVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator<char> local_214;
  allocator_type local_213;
  allocator<char> local_212;
  allocator<char> local_211;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_diff_index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_update_index;
  DiffParser out;
  string local_140;
  string local_120;
  string git;
  OutputLogger err;
  OutputLogger ui_err;
  OutputLogger ui_out;
  
  std::__cxx11::string::string
            ((string *)&git,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool
            );
  std::__cxx11::string::string((string *)&out,(string *)&git);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_LineParser.Line._M_string_length,"update-index",
             (allocator<char> *)&ui_out);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.Changes,"--refresh",(allocator<char> *)&ui_err);
  __l._M_len = 3;
  __l._M_array = (iterator)&out;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&git_update_index,__l,(allocator_type *)&err);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&out.super_LineParser.super_OutputParser._vptr_OutputParser + lVar1)
              );
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  cmProcessTools::OutputLogger::OutputLogger
            (&ui_out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"ui-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&ui_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"ui-err> ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"",(allocator<char> *)&out);
  cmCTestVC::RunChild((cmCTestVC *)this,&git_update_index,(OutputParser *)&ui_out,
                      (OutputParser *)&ui_err,&local_120,UTF8);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&out,(string *)&git);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_LineParser.Line._M_string_length,"diff-index",
             (allocator<char> *)&err);
  std::__cxx11::string::string<std::allocator<char>>((string *)&out.Changes,"-z",&local_214);
  std::__cxx11::string::string<std::allocator<char>>((string *)&out.DiffField,"HEAD",&local_211);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)out.CurChange.Path.field_2._M_local_buf,"--",&local_212);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&out;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&git_diff_index,__l_00,&local_213);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&out.super_LineParser.super_OutputParser._vptr_OutputParser + lVar1)
              );
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  DiffParser::DiffParser(&out,this,"di-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"di-err> ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"",&local_214);
  cmCTestVC::RunChild((cmCTestVC *)this,&git_diff_index,(OutputParser *)&out,(OutputParser *)&err,
                      &local_140,UTF8);
  std::__cxx11::string::~string((string *)&local_140);
  for (pCVar2 = out.Changes.
                super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar2 != out.Changes.
                super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar2 = pCVar2 + 1) {
    (*(this->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])(this,1,&pCVar2->Path);
  }
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  DiffParser::~DiffParser(&out);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&git_diff_index);
  cmProcessTools::LineParser::~LineParser(&ui_err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&ui_out.super_LineParser);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&git_update_index);
  std::__cxx11::string::~string((string *)&git);
  return true;
}

Assistant:

bool cmCTestGIT::LoadModifications()
{
  std::string git = this->CommandLineTool;

  // Use 'git update-index' to refresh the index w.r.t. the work tree.
  std::vector<std::string> git_update_index = { git, "update-index",
                                                "--refresh" };
  OutputLogger ui_out(this->Log, "ui-out> ");
  OutputLogger ui_err(this->Log, "ui-err> ");
  this->RunChild(git_update_index, &ui_out, &ui_err, "",
                 cmProcessOutput::UTF8);

  // Use 'git diff-index' to get modified files.
  std::vector<std::string> git_diff_index = { git, "diff-index", "-z", "HEAD",
                                              "--" };
  DiffParser out(this, "di-out> ");
  OutputLogger err(this->Log, "di-err> ");
  this->RunChild(git_diff_index, &out, &err, "", cmProcessOutput::UTF8);

  for (Change const& c : out.Changes) {
    this->DoModification(PathModified, c.Path);
  }
  return true;
}